

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzAddMod(word *c,word *a,word *b,word *mod,size_t n)

{
  ulong uVar1;
  word *in_RCX;
  long in_RDX;
  long in_RSI;
  word *in_RDI;
  ulong in_R8;
  size_t i;
  word w;
  word mask;
  word carry;
  ulong local_48;
  ulong local_38;
  ulong local_30;
  
  local_30 = 0;
  local_38 = 1;
  for (local_48 = 0; local_48 < in_R8; local_48 = local_48 + 1) {
    uVar1 = *(long *)(in_RSI + local_48 * 8) + local_30;
    in_RDI[local_48] = uVar1 + *(long *)(in_RDX + local_48 * 8);
    local_30 = (ulong)(int)(uint)(in_RDI[local_48] < uVar1 || uVar1 < local_30);
    local_38 = (long)(int)(uint)(in_RCX[local_48] < in_RDI[local_48]) |
               (long)(int)(uint)(in_RCX[local_48] == in_RDI[local_48]) & local_38;
  }
  zzSubAndW(in_RDI,in_RCX,in_R8,-(local_30 | local_38));
  return;
}

Assistant:

void SAFE(zzAddMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	register word carry = 0;
	register word mask = 1;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	// add 	
	for (i = 0; i < n; ++i)
	{
		w = a[i] + carry;
		carry = wordLess01(w, carry);
		c[i] = w + b[i];
		carry |= wordLess01(c[i], w);
		// mask <- mod[i] < c[i] || mask && mod[i] == c[i];
		mask &= wordEq01(mod[i], c[i]);
		mask |= wordLess01(mod[i], c[i]);
	}
	// sub
	mask |= carry;
	mask = WORD_0 - mask;
	zzSubAndW(c, mod, n, mask);
	w = mask = carry = 0;
}